

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O3

Dec_Graph_t * Abc_NodeMffcConstants(Abc_ManRst_t *p,Vec_Int_t *vSims)

{
  Dec_Graph_t *pDVar1;
  Dec_Graph_t *pDVar2;
  
  if ((long)vSims->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  if (vSims->pArray[(long)vSims->nSize + -1] == -1) {
    pDVar1 = (Dec_Graph_t *)calloc(1,0x20);
    pDVar2 = pDVar1;
  }
  else {
    if (vSims->pArray[(long)vSims->nSize + -1] != 0) {
      __assert_fail("pGraph",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                    ,0x4f2,"Dec_Graph_t *Abc_NodeMffcConstants(Abc_ManRst_t *, Vec_Int_t *)");
    }
    pDVar1 = (Dec_Graph_t *)calloc(1,0x20);
    pDVar1->fConst = 1;
    pDVar2 = (Dec_Graph_t *)&pDVar1->eRoot;
  }
  pDVar2->fConst = 1;
  return pDVar1;
}

Assistant:

Dec_Graph_t * Abc_NodeMffcConstants( Abc_ManRst_t * p, Vec_Int_t * vSims )
{
    Dec_Graph_t * pGraph = NULL;
    unsigned uRoot;
    // get the root node
    uRoot = (unsigned)Vec_IntEntryLast( vSims );
    // get the graph if the node looks constant
    if ( uRoot == 0 )
        pGraph = Dec_GraphCreateConst0();
    else if ( uRoot == ~(unsigned)0 )
        pGraph = Dec_GraphCreateConst1();
    // check the graph
    assert(pGraph);
    if ( Abc_NodeCheckFull( p, pGraph ) )
        return pGraph;
    Dec_GraphFree( pGraph );
    return NULL;
}